

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
argo::parser::parse_name_value_pair
          (parser *this,lexer *l,unique_ptr<argo::json,_std::default_delete<argo::json>_> *object,
          size_t nesting_depth)

{
  undefined1 __p [8];
  token_type tVar1;
  token *ptVar2;
  string *psVar3;
  json_object *this_00;
  __uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> *this_01;
  json_parser_exception *pjVar4;
  size_t sVar5;
  undefined1 local_50 [8];
  string name;
  
  ptVar2 = lexer::next(l);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  tVar1 = token::get_type(ptVar2);
  if (tVar1 != string_e) {
    pjVar4 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    psVar3 = token::get_raw_value_abi_cxx11_(ptVar2);
    sVar5 = reader::get_byte_index(this->m_reader);
    json_parser_exception::json_parser_exception(pjVar4,unexpected_token_e,psVar3,sVar5);
    __cxa_throw(pjVar4,&json_parser_exception::typeinfo,std::exception::~exception);
  }
  if (this->m_convert_strings == true) {
    psVar3 = token::get_raw_value_abi_cxx11_(ptVar2);
    utf8::json_string_to_utf8((utf8 *)local_50,psVar3);
    std::__cxx11::string::_M_assign((string *)&name);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50);
  }
  else {
    token::get_raw_value_abi_cxx11_(ptVar2);
    std::__cxx11::string::_M_assign((string *)&name);
  }
  ptVar2 = lexer::next(l);
  tVar1 = token::get_type(ptVar2);
  if (tVar1 == name_separator_e) {
    parse_value((parser *)local_50,(lexer *)this,(size_t)l);
    this_00 = json::get_object_abi_cxx11_
                        ((object->_M_t).
                         super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                         super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                         super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
    this_01 = (__uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
              ::operator[](this_00,&name);
    __p = local_50;
    local_50 = (undefined1  [8])0x0;
    std::__uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>::reset(this_01,(pointer)__p);
    std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
              ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_50);
    std::__cxx11::string::~string((string *)&name);
    return;
  }
  pjVar4 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
  psVar3 = token::get_raw_value_abi_cxx11_(ptVar2);
  sVar5 = reader::get_byte_index(this->m_reader);
  json_parser_exception::json_parser_exception(pjVar4,unexpected_token_e,psVar3,sVar5);
  __cxa_throw(pjVar4,&json_parser_exception::typeinfo,std::exception::~exception);
}

Assistant:

void parser::parse_name_value_pair(lexer &l, unique_ptr<json> &object, size_t nesting_depth)
{
    const token &t1 = l.next();

    string name;

    if (t1.get_type() == token::string_e)
    {
        if (m_convert_strings)
        {
            name = *utf8::json_string_to_utf8(t1.get_raw_value());
        }
        else
        {
            name = t1.get_raw_value();
        }
    }
    else
    {
        throw json_parser_exception(
                        json_parser_exception::unexpected_token_e,
                        t1.get_raw_value(),
                        m_reader.get_byte_index());
    }

    const token &t2 = l.next();

    if (t2.get_type() != token::name_separator_e)
    {
        throw json_parser_exception(
                            json_parser_exception::unexpected_token_e,
                            t2.get_raw_value(),
                            m_reader.get_byte_index());
    }

    object->get_object()[name] = parse_value(l, nesting_depth);
}